

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestChildExtension::_InternalSerialize
          (TestChildExtension *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  WireFormatLite *pWVar1;
  ulong uVar2;
  TestAllExtensions *value;
  anon_union_32_1_493b367e_for_TestChildExtension_3 aVar3;
  undefined8 *puVar4;
  uint8_t *puVar5;
  char *in_R9;
  string_view s;
  string_view s_00;
  string_view field_name;
  string_view field_name_00;
  
  aVar3 = this->field_0;
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    puVar4 = (undefined8 *)((ulong)(this->field_0)._impl_.a_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pWVar1 = (WireFormatLite *)*puVar4;
    uVar2 = puVar4[1];
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"edition_unittest.TestChildExtension.a";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar1,(char *)(uVar2 & 0xffffffff),1,0x25,field_name);
    s._M_str = (char *)pWVar1;
    s._M_len = uVar2;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
    puVar4 = (undefined8 *)((ulong)(this->field_0)._impl_.b_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pWVar1 = (WireFormatLite *)*puVar4;
    uVar2 = puVar4[1];
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"edition_unittest.TestChildExtension.b";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar1,(char *)(uVar2 & 0xffffffff),1,0x25,field_name_00);
    s_00._M_str = (char *)pWVar1;
    s_00._M_len = uVar2;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,s_00,target);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
    value = (this->field_0)._impl_.optional_extension_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestChildExtension::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestChildExtension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestChildExtension)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // string a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_a();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestChildExtension.a");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // string b = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::absl::string_view _s = this_._internal_b();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestChildExtension.b");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // .edition_unittest.TestAllExtensions optional_extension = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.optional_extension_, this_._impl_.optional_extension_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestChildExtension)
  return target;
}